

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_59::InMemoryDirectory::ReplacerImpl<kj::File>::tryCommit
          (ReplacerImpl<kj::File> *this)

{
  Impl *pIVar1;
  byte bVar2;
  InMemoryDirectory *pIVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  StringPtr name;
  DebugExpression<bool> _kjCondition;
  Fault f;
  InMemoryFileFactory *local_40;
  
  bVar2 = (this->super_Replacer<kj::File>).field_0xc;
  _kjCondition.value = (bool)(bVar2 ^ 1);
  if (bVar2 == 0) {
    pIVar3 = (this->directory).ptr;
    f.exception._0_1_ = 0;
    kj::_::Mutex::lock(&(pIVar3->impl).mutex,0);
    pIVar1 = &(pIVar3->impl).value;
    sVar4 = (this->name).content.size_;
    if (sVar4 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (this->name).content.ptr;
    }
    name.content.size_ = (size_t)pcVar7;
    name.content.ptr = (char *)pIVar1;
    Impl::openEntry((Impl *)&f,name,(int)sVar4 + (uint)(sVar4 == 0));
    lVar5 = CONCAT71(f.exception._1_7_,f.exception._0_1_);
    bVar9 = lVar5 != 0;
    if (bVar9) {
      (*(((this->inner).ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[5])(&f);
      uVar8 = CONCAT71(f.exception._1_7_,f.exception._0_1_);
      if (local_40 == (InMemoryFileFactory *)0x0) {
        uVar8 = 0;
      }
      if (*(int *)(lVar5 + 0x18) != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                   *)(lVar5 + 0x18));
      }
      *(undefined8 *)(lVar5 + 0x20) = uVar8;
      *(InMemoryFileFactory **)(lVar5 + 0x28) = local_40;
      *(undefined4 *)(lVar5 + 0x18) = 1;
      iVar6 = (**pIVar1->clock->_vptr_Clock)();
      (pIVar3->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar6);
    }
    kj::_::Mutex::unlock(&(pIVar3->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[24]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x5d3,FAILED,"!committed","_kjCondition,\"commit() already called\"",&_kjCondition,
               (char (*) [24])"commit() already called");
    kj::_::Debug::Fault::~Fault(&f);
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry.set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }